

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ORForest.cpp
# Opt level: O0

void __thiscall RandomForest::ORForest<double>::ORForest(ORForest<double> *this)

{
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  local_30;
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  local_20;
  ORForest<double> *local_10;
  ORForest<double> *this_local;
  
  local_10 = this;
  std::vector<RandomForest::ODTree<double>,_std::allocator<RandomForest::ODTree<double>_>_>::vector
            (&this->trees);
  std::
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::shared_ptr(&this->trainData);
  std::
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::shared_ptr(&this->testData);
  this->treeNumber = 0x14;
  this->maxDepth = 10;
  this->leastNsample = 10;
  std::
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::shared_ptr(&local_20,(nullptr_t)0x0);
  std::
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::operator=(&this->trainData,&local_20);
  std::
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::~shared_ptr(&local_20);
  std::
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::shared_ptr(&local_30,(nullptr_t)0x0);
  std::
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::operator=(&this->testData,&local_30);
  std::
  shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::~shared_ptr(&local_30);
  this->testDataRatio = 0.3;
  this->balanceType = SingleParameterBoostrap;
  this->samplingType = DownSamplingMajority;
  this->onlineUpdate = true;
  return;
}

Assistant:

RandomForest::ORForest<T>::ORForest()
{
	treeNumber=20;
	maxDepth=10;
	leastNsample=10;
    trainData=nullptr;;
    testData=nullptr;
    testDataRatio=0.3;
    balanceType=SingleParameterBoostrap;
    samplingType=DownSamplingMajority;
    onlineUpdate=true;
}